

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrefixTools.cpp
# Opt level: O1

TSNode_conflict *
getNamedChildNode(TSNode_conflict *__return_storage_ptr__,TSNode_conflict parent,char *name)

{
  TSNode self;
  uint32_t uVar1;
  int iVar2;
  char *__s1;
  uint32_t child_index;
  
  uVar1 = ts_node_named_child_count((TSNode)parent);
  if (uVar1 != 0) {
    child_index = 0;
    do {
      ts_node_named_child((TSNode *)__return_storage_ptr__,(TSNode)parent,child_index);
      self.context[0] = __return_storage_ptr__->context[0];
      self.context[1] = __return_storage_ptr__->context[1];
      self.context[2] = __return_storage_ptr__->context[2];
      self.context[3] = __return_storage_ptr__->context[3];
      self.id = __return_storage_ptr__->id;
      self.tree = __return_storage_ptr__->tree;
      __s1 = ts_node_type(self);
      iVar2 = strcmp(__s1,name);
      if (iVar2 == 0) {
        return __return_storage_ptr__;
      }
      child_index = child_index + 1;
    } while (uVar1 != child_index);
  }
  __return_storage_ptr__->id = (void *)0x0;
  __return_storage_ptr__->tree = (TSTree *)0x0;
  __return_storage_ptr__->context[0] = 0;
  __return_storage_ptr__->context[1] = 0;
  __return_storage_ptr__->context[2] = 0;
  __return_storage_ptr__->context[3] = 0;
  return __return_storage_ptr__;
}

Assistant:

TSNode getNamedChildNode(TSNode parent, const char *name) {
    auto childCount = ts_node_named_child_count(parent);
    for (uint32_t i = 0; i < childCount; i++) {
        TSNode child = ts_node_named_child(parent, i);
        if (std::strcmp(ts_node_type(child), name) == 0) return child;
    }

    return TSNode {};
}